

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeEstimatorUtils.cpp
# Opt level: O2

bool getUnitVector(Vector3 *in,Vector3 *out)

{
  RealScalar RVar1;
  double dVar2;
  Vector3 *local_20 [2];
  
  local_20[0] = in;
  RVar1 = Eigen::
          MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
          ::norm((MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                  *)local_20);
  if ((RVar1 != 0.0) || (NAN(RVar1))) {
    out->m_data[2] = in->m_data[2];
    dVar2 = in->m_data[1];
    out->m_data[0] = in->m_data[0];
    out->m_data[1] = dVar2;
    local_20[0] = out;
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>::
    normalize((MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
               *)local_20);
  }
  return (bool)(-(RVar1 != 0.0) & 1);
}

Assistant:

bool getUnitVector(const iDynTree::Vector3& in, iDynTree::Vector3& out)
{
    using iDynTree::toEigen;

    double norm{toEigen(in).norm()};
    if (norm == 0)
    {
        return false;
    }

    out = in;
    toEigen(out).normalize();
    return true;
}